

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_CollectSuper(Gia_Obj_t *pObj,int fUseMuxes,Vec_Ptr_t *vSuper)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                  ,0x108,"void Cec_CollectSuper(Gia_Obj_t *, int, Vec_Ptr_t *)");
  }
  if ((~*(uint *)pObj & 0x9fffffff) != 0) {
    vSuper->nSize = 0;
    Cec_CollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return;
  }
  __assert_fail("!Gia_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                ,0x109,"void Cec_CollectSuper(Gia_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

void Cec_CollectSuper( Gia_Obj_t * pObj, int fUseMuxes, Vec_Ptr_t * vSuper )
{
    assert( !Gia_IsComplement(pObj) );
    assert( !Gia_ObjIsCi(pObj) );
    Vec_PtrClear( vSuper );
    Cec_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
}